

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_sha1.c
# Opt level: O3

void csp_sha1_compress(csp_sha1_state_t *sha1,uint8_t *buf)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint32_t uVar10;
  uint uVar11;
  uint32_t uVar12;
  uint uVar13;
  uint32_t uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint auStack_1b8 [8];
  uint auStack_198 [5];
  uint auStack_184 [85];
  
  lVar6 = 0;
  do {
    uVar1 = *(uint *)(buf + lVar6 * 4);
    auStack_184[lVar6 + 3] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  uVar2 = sha1->state[0];
  uVar3 = sha1->state[1];
  uVar4 = sha1->state[2];
  uVar1 = sha1->state[3];
  uVar5 = sha1->state[4];
  lVar6 = 0x10;
  do {
    uVar9 = auStack_198[lVar6] ^ auStack_184[lVar6] ^ auStack_1b8[lVar6 + 2] ^ auStack_1b8[lVar6];
    auStack_184[lVar6 + 3] = uVar9 << 1 | (uint)((int)uVar9 < 0);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x50);
  uVar17 = 0xfffffffffffffffb;
  uVar9 = uVar5;
  uVar15 = uVar1;
  uVar10 = uVar4;
  uVar12 = uVar3;
  uVar14 = uVar2;
  do {
    uVar11 = uVar12 << 0x1e | uVar12 >> 2;
    uVar7 = ((uVar15 ^ uVar10) & uVar12 ^ uVar15) + (uVar14 << 5 | uVar14 >> 0x1b) + uVar9 +
            auStack_184[uVar17 + 8] + 0x5a827999;
    uVar15 = ((uVar11 ^ uVar10) & uVar14 ^ uVar10) + uVar15 + auStack_184[uVar17 + 9] + 0x5a827999 +
             (uVar7 * 0x20 | uVar7 >> 0x1b);
    uVar13 = uVar14 << 0x1e | uVar14 >> 2;
    uVar9 = uVar7 * 0x40000000 | uVar7 >> 2;
    uVar7 = uVar10 + auStack_184[uVar17 + 10] + ((uVar11 ^ uVar13) & uVar7 ^ uVar11) + 0x5a827999 +
            (uVar15 * 0x20 | uVar15 >> 0x1b);
    uVar12 = uVar11 + auStack_184[uVar17 + 0xb] + ((uVar9 ^ uVar13) & uVar15 ^ uVar13) + 0x5a827999
             + (uVar7 * 0x20 | uVar7 >> 0x1b);
    uVar15 = uVar15 * 0x40000000 | uVar15 >> 2;
    uVar14 = uVar13 + auStack_184[uVar17 + 0xc] + ((uVar15 ^ uVar9) & uVar7 ^ uVar9) + 0x5a827999 +
             (uVar12 * 0x20 | uVar12 >> 0x1b);
    uVar10 = uVar7 * 0x40000000 | uVar7 >> 2;
    uVar17 = uVar17 + 5;
  } while (uVar17 < 0xf);
  uVar17 = 0xf;
  do {
    uVar7 = (uVar10 ^ uVar12 ^ uVar15) + (uVar14 << 5 | uVar14 >> 0x1b) + uVar9 +
            auStack_184[uVar17 + 8] + 0x6ed9eba1;
    uVar11 = uVar12 << 0x1e | uVar12 >> 2;
    uVar13 = uVar14 << 0x1e | uVar14 >> 2;
    uVar16 = (uVar14 ^ uVar10 ^ uVar11) + uVar15 + auStack_184[uVar17 + 9] + 0x6ed9eba1 +
             (uVar7 * 0x20 | uVar7 >> 0x1b);
    uVar9 = uVar7 * 0x40000000 | uVar7 >> 2;
    uVar7 = uVar10 + auStack_184[uVar17 + 10] + (uVar11 ^ uVar13 ^ uVar7) + 0x6ed9eba1 +
            (uVar16 * 0x20 | uVar16 >> 0x1b);
    uVar15 = uVar16 * 0x40000000 | uVar16 >> 2;
    uVar12 = uVar11 + auStack_184[uVar17 + 0xb] + (uVar9 ^ uVar13 ^ uVar16) + 0x6ed9eba1 +
             (uVar7 * 0x20 | uVar7 >> 0x1b);
    uVar14 = uVar13 + auStack_184[uVar17 + 0xc] + (uVar15 ^ uVar9 ^ uVar7) + 0x6ed9eba1 +
             (uVar12 * 0x20 | uVar12 >> 0x1b);
    uVar10 = uVar7 * 0x40000000 | uVar7 >> 2;
    uVar17 = uVar17 + 5;
  } while (uVar17 < 0x23);
  uVar17 = 0x23;
  do {
    iVar8 = ((uVar10 | uVar12) & uVar15 | uVar10 & uVar12) + (uVar14 << 5 | uVar14 >> 0x1b) + uVar9
            + auStack_184[uVar17 + 8];
    uVar9 = iVar8 + 0x8f1bbcdc;
    uVar11 = uVar12 << 0x1e | uVar12 >> 2;
    uVar16 = ((uVar11 | uVar14) & uVar10 | uVar11 & uVar14) + uVar15 + auStack_184[uVar17 + 9] +
             -0x70e44324 + (uVar9 * 0x20 | uVar9 >> 0x1b);
    uVar13 = uVar14 << 0x1e | uVar14 >> 2;
    uVar7 = uVar10 + auStack_184[uVar17 + 10] + ((uVar9 | uVar13) & uVar11 | uVar9 & uVar13) +
            -0x70e44324 + (uVar16 * 0x20 | uVar16 >> 0x1b);
    uVar9 = iVar8 * 0x40000000 | uVar9 >> 2;
    uVar15 = uVar16 * 0x40000000 | uVar16 >> 2;
    uVar12 = uVar11 + auStack_184[uVar17 + 0xb] + ((uVar16 | uVar9) & uVar13 | uVar16 & uVar9) +
             -0x70e44324 + (uVar7 * 0x20 | uVar7 >> 0x1b);
    uVar14 = uVar13 + auStack_184[uVar17 + 0xc] + ((uVar7 | uVar15) & uVar9 | uVar7 & uVar15) +
             -0x70e44324 + (uVar12 * 0x20 | uVar12 >> 0x1b);
    uVar10 = uVar7 * 0x40000000 | uVar7 >> 2;
    uVar17 = uVar17 + 5;
  } while (uVar17 < 0x37);
  uVar17 = 0x37;
  do {
    uVar7 = (uVar10 ^ uVar12 ^ uVar15) + (uVar14 << 5 | uVar14 >> 0x1b) + uVar9 +
            auStack_184[uVar17 + 8] + 0xca62c1d6;
    uVar11 = uVar12 << 0x1e | uVar12 >> 2;
    uVar13 = uVar14 << 0x1e | uVar14 >> 2;
    uVar16 = (uVar14 ^ uVar10 ^ uVar11) + uVar15 + auStack_184[uVar17 + 9] + -0x359d3e2a +
             (uVar7 * 0x20 | uVar7 >> 0x1b);
    uVar9 = uVar7 * 0x40000000 | uVar7 >> 2;
    uVar7 = uVar10 + auStack_184[uVar17 + 10] + (uVar11 ^ uVar13 ^ uVar7) + -0x359d3e2a +
            (uVar16 * 0x20 | uVar16 >> 0x1b);
    uVar15 = uVar16 * 0x40000000 | uVar16 >> 2;
    uVar12 = uVar11 + auStack_184[uVar17 + 0xb] + (uVar9 ^ uVar13 ^ uVar16) + -0x359d3e2a +
             (uVar7 * 0x20 | uVar7 >> 0x1b);
    uVar14 = uVar13 + auStack_184[uVar17 + 0xc] + (uVar15 ^ uVar9 ^ uVar7) + -0x359d3e2a +
             (uVar12 * 0x20 | uVar12 >> 0x1b);
    uVar10 = uVar7 * 0x40000000 | uVar7 >> 2;
    uVar17 = uVar17 + 5;
  } while (uVar17 < 0x4b);
  sha1->state[0] = uVar14 + uVar2;
  sha1->state[1] = uVar12 + uVar3;
  sha1->state[2] = uVar10 + uVar4;
  sha1->state[3] = uVar15 + uVar1;
  sha1->state[4] = uVar9 + uVar5;
  return;
}

Assistant:

static void csp_sha1_compress(csp_sha1_state_t * sha1, const uint8_t * buf) {

	uint32_t a, b, c, d, e, W[80], i;

	/* Copy the state into 512-bits into W[0..15] */
	for (i = 0; i < 16; i++)
		LOAD32H(W[i], buf + (4 * i));

	/* Copy state */
	a = sha1->state[0];
	b = sha1->state[1];
	c = sha1->state[2];
	d = sha1->state[3];
	e = sha1->state[4];

	/* Expand it */
	for (i = 16; i < 80; i++)
		W[i] = ROL(W[i - 3] ^ W[i - 8] ^ W[i - 14] ^ W[i - 16], 1);

	/* Compress */
	i = 0;

	/* Round one */
	for (; i < 20;) {
		FF_0(a, b, c, d, e, i++);
		FF_0(e, a, b, c, d, i++);
		FF_0(d, e, a, b, c, i++);
		FF_0(c, d, e, a, b, i++);
		FF_0(b, c, d, e, a, i++);
	}

	/* Round two */
	for (; i < 40;) {
		FF_1(a, b, c, d, e, i++);
		FF_1(e, a, b, c, d, i++);
		FF_1(d, e, a, b, c, i++);
		FF_1(c, d, e, a, b, i++);
		FF_1(b, c, d, e, a, i++);
	}

	/* Round three */
	for (; i < 60;) {
		FF_2(a, b, c, d, e, i++);
		FF_2(e, a, b, c, d, i++);
		FF_2(d, e, a, b, c, i++);
		FF_2(c, d, e, a, b, i++);
		FF_2(b, c, d, e, a, i++);
	}

	/* Round four */
	for (; i < 80;) {
		FF_3(a, b, c, d, e, i++);
		FF_3(e, a, b, c, d, i++);
		FF_3(d, e, a, b, c, i++);
		FF_3(c, d, e, a, b, i++);
		FF_3(b, c, d, e, a, i++);
	}

	/* Store */
	sha1->state[0] += a;
	sha1->state[1] += b;
	sha1->state[2] += c;
	sha1->state[3] += d;
	sha1->state[4] += e;
}